

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O1

bool __thiscall flexbuffers::Reference::MutateFloat(Reference *this,double d)

{
  byte bVar1;
  ulong *puVar2;
  bool bVar3;
  ulong uVar4;
  uint8_t *puVar5;
  uint8_t *dest;
  
  if (this->type_ == FBT_INDIRECT_FLOAT) {
    puVar2 = (ulong *)this->data_;
    bVar1 = this->parent_width_;
    if (bVar1 < 4) {
      if (bVar1 < 2) {
        uVar4 = (ulong)(byte)*puVar2;
      }
      else {
        uVar4 = (ulong)(ushort)*puVar2;
      }
    }
    else if (bVar1 < 8) {
      uVar4 = (ulong)(uint)*puVar2;
    }
    else {
      uVar4 = *puVar2;
    }
    dest = (uint8_t *)((long)puVar2 - uVar4);
    puVar5 = &this->byte_width_;
  }
  else {
    if (this->type_ != FBT_FLOAT) {
      return false;
    }
    dest = this->data_;
    puVar5 = &this->parent_width_;
  }
  bVar3 = MutateF<double>(this,dest,d,(ulong)*puVar5,
                          -(uint)((double)(float)d == d) & BIT_WIDTH_16 ^ BIT_WIDTH_64);
  return bVar3;
}

Assistant:

bool MutateFloat(double d) {
    if (type_ == FBT_FLOAT) {
      return MutateF(data_, d, parent_width_, WidthF(d));
    } else if (type_ == FBT_INDIRECT_FLOAT) {
      return MutateF(Indirect(), d, byte_width_, WidthF(d));
    } else {
      return false;
    }
  }